

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_match_sse4.c
# Opt level: O2

double aom_compute_correlation_sse4_1
                 (uchar *frame1,int stride1,int x1,int y1,double mean1,double one_over_stddev1,
                 uchar *frame2,int stride2,int x2,int y2,double mean2,double one_over_stddev2)

{
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  int iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar16 [16];
  
  pauVar2 = (undefined1 (*) [16])(frame1 + (x1 + (y1 + -7) * stride1 + -7));
  pauVar3 = (undefined1 (*) [16])(frame2 + (x2 + (y2 + -7) * stride2 + -7));
  iVar4 = 0x10;
  iVar10 = 0;
  iVar11 = 0;
  iVar12 = 0;
  iVar13 = 0;
  iVar6 = 0;
  iVar7 = 0;
  iVar8 = 0;
  iVar9 = 0;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    auVar16 = *pauVar2;
    auVar1 = *pauVar3;
    in_XMM9 = pmovzxbw(in_XMM9,auVar16);
    auVar14[1] = 0;
    auVar14[0] = auVar16[8];
    auVar14[2] = auVar16[9];
    auVar14[3] = 0;
    auVar14[4] = auVar16[10];
    auVar14[5] = 0;
    auVar14[6] = auVar16[0xb];
    auVar14[7] = 0;
    auVar14[8] = auVar16[0xc];
    auVar14[9] = 0;
    auVar14[10] = auVar16[0xd];
    auVar14[0xb] = 0;
    auVar14[0xc] = auVar16[0xe];
    auVar14[0xd] = 0;
    auVar14[0xe] = auVar16[0xf];
    auVar14[0xf] = 0;
    auVar16 = pmovzxbw(in_XMM10,auVar1);
    in_XMM10 = pmaddwd(auVar16,in_XMM9);
    auVar15[1] = 0;
    auVar15[0] = auVar1[8];
    auVar15[2] = auVar1[9];
    auVar15[3] = 0;
    auVar15[4] = auVar1[10];
    auVar15[5] = 0;
    auVar15[6] = auVar1[0xb];
    auVar15[7] = 0;
    auVar15[8] = auVar1[0xc];
    auVar15[9] = 0;
    auVar15[10] = auVar1[0xd];
    auVar15[0xb] = 0;
    auVar15[0xc] = auVar1[0xe];
    auVar15[0xd] = 0;
    auVar15[0xe] = auVar1[0xf];
    auVar15[0xf] = 0;
    auVar16 = pmaddwd(auVar15,auVar14);
    iVar6 = iVar6 + in_XMM10._0_4_;
    iVar7 = iVar7 + in_XMM10._4_4_;
    iVar8 = iVar8 + in_XMM10._8_4_;
    iVar9 = iVar9 + in_XMM10._12_4_;
    iVar10 = iVar10 + auVar16._0_4_;
    iVar11 = iVar11 + auVar16._4_4_;
    iVar12 = iVar12 + auVar16._8_4_;
    iVar13 = iVar13 + auVar16._12_4_;
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + stride1);
    pauVar3 = (undefined1 (*) [16])(*pauVar3 + stride2);
  }
  auVar16._0_4_ = iVar6 + iVar10;
  auVar16._4_4_ = iVar7 + iVar11;
  auVar16._8_4_ = iVar8 + iVar12;
  auVar16._12_4_ = iVar9 + iVar13;
  auVar16 = phaddd(auVar16,auVar16);
  auVar16 = phaddd(auVar16,auVar16);
  return one_over_stddev1 * one_over_stddev2 * ((double)auVar16._0_4_ - mean1 * mean2);
}

Assistant:

double aom_compute_correlation_sse4_1(const unsigned char *frame1, int stride1,
                                      int x1, int y1, double mean1,
                                      double one_over_stddev1,
                                      const unsigned char *frame2, int stride2,
                                      int x2, int y2, double mean2,
                                      double one_over_stddev2) {
  // 8 32-bit partial sums of products
  __m128i cross_vec_l = _mm_setzero_si128();
  __m128i cross_vec_r = _mm_setzero_si128();

  frame1 += (y1 - MATCH_SZ_BY2) * stride1 + (x1 - MATCH_SZ_BY2);
  frame2 += (y2 - MATCH_SZ_BY2) * stride2 + (x2 - MATCH_SZ_BY2);

  for (int i = 0; i < MATCH_SZ; ++i) {
    const __m128i v1 = _mm_loadu_si128((__m128i *)frame1);
    const __m128i v2 = _mm_loadu_si128((__m128i *)frame2);

    const __m128i v1_l = _mm_cvtepu8_epi16(v1);
    const __m128i v1_r = _mm_cvtepu8_epi16(_mm_srli_si128(v1, 8));
    const __m128i v2_l = _mm_cvtepu8_epi16(v2);
    const __m128i v2_r = _mm_cvtepu8_epi16(_mm_srli_si128(v2, 8));

    cross_vec_l = _mm_add_epi32(cross_vec_l, _mm_madd_epi16(v1_l, v2_l));
    cross_vec_r = _mm_add_epi32(cross_vec_r, _mm_madd_epi16(v1_r, v2_r));

    frame1 += stride1;
    frame2 += stride2;
  }

  // Sum cross_vec into a single value
  const __m128i tmp = _mm_add_epi32(cross_vec_l, cross_vec_r);
  const int cross = _mm_extract_epi32(tmp, 0) + _mm_extract_epi32(tmp, 1) +
                    _mm_extract_epi32(tmp, 2) + _mm_extract_epi32(tmp, 3);

  // Note: In theory, the calculations here "should" be
  //   covariance = cross / N^2 - mean1 * mean2
  //   correlation = covariance / (stddev1 * stddev2).
  //
  // However, because of the scaling in aom_compute_mean_stddev, the
  // lines below actually calculate
  //   covariance * N^2 = cross - (mean1 * N) * (mean2 * N)
  //   correlation = (covariance * N^2) / ((stddev1 * N) * (stddev2 * N))
  //
  // ie. we have removed the need for a division, and still end up with the
  // correct unscaled correlation (ie, in the range [-1, +1])
  const double covariance = cross - mean1 * mean2;
  const double correlation = covariance * (one_over_stddev1 * one_over_stddev2);
  return correlation;
}